

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O2

easm_sinsn * dis_parse_sinsn(disctx *ctx,dis_status *status,int *spos)

{
  int iVar1;
  etype eVar2;
  int iVar3;
  litem **pplVar4;
  easm_sinsn *peVar5;
  litem *plVar6;
  easm_mods *peVar7;
  easm_mod *peVar8;
  easm_mod **__ptr;
  easm_operand *peVar9;
  easm_expr **ppeVar10;
  easm_expr *peVar11;
  easm_operand **__ptr_00;
  int iVar12;
  ulong local_58;
  
  peVar5 = (easm_sinsn *)calloc(0x40,1);
  pplVar4 = ctx->atoms;
  iVar12 = *spos;
  plVar6 = pplVar4[iVar12];
  peVar5->str = plVar6->str;
  iVar1 = plVar6->isunk;
  peVar5->isunk = iVar1;
  if (iVar1 != 0) {
    *(undefined1 *)status = (char)*status | DIS_STATUS_UNK_INSN;
    iVar12 = *spos;
    plVar6 = pplVar4[iVar12];
  }
  iVar12 = iVar12 + 1;
  *spos = iVar12;
  if (plVar6->type != LITEM_NAME) {
    abort();
  }
  peVar7 = (easm_mods *)calloc(0x28,1);
  __ptr_00 = (easm_operand **)0x0;
  iVar1 = 0;
  local_58 = 0;
  while (iVar12 < ctx->atomsnum) {
    pplVar4 = ctx->atoms;
    plVar6 = pplVar4[iVar12];
    eVar2 = plVar6->type;
    if (eVar2 == LITEM_NAME) {
      peVar8 = (easm_mod *)calloc(0x28,1);
      peVar8->str = plVar6->str;
      iVar12 = pplVar4[iVar12]->isunk;
      peVar8->isunk = iVar12;
      if (iVar12 != 0) {
        *(undefined1 *)status = (char)*status | DIS_STATUS_UNK_OPERAND;
      }
      iVar12 = peVar7->modsnum;
      iVar3 = peVar7->modsmax;
      __ptr = peVar7->mods;
      if (iVar3 <= iVar12) {
        iVar12 = iVar3 * 2;
        if (iVar3 == 0) {
          iVar12 = 0x10;
        }
        peVar7->modsmax = iVar12;
        __ptr = (easm_mod **)realloc(__ptr,(long)iVar12 << 3);
        peVar7->mods = __ptr;
        iVar12 = peVar7->modsnum;
      }
      peVar7->modsnum = iVar12 + 1;
      __ptr[iVar12] = peVar8;
      iVar12 = *spos + 1;
      *spos = iVar12;
    }
    else {
      if (eVar2 == LITEM_SEEND) break;
      peVar9 = (easm_operand *)calloc(0x30,1);
      peVar9->mods = peVar7;
      peVar7 = (easm_mods *)calloc(0x28,1);
      peVar9->exprsmax = 0x10;
      ppeVar10 = (easm_expr **)malloc(0x80);
      peVar9->exprs = ppeVar10;
      peVar11 = dis_parse_expr(ctx,status,spos);
      iVar12 = peVar9->exprsnum;
      peVar9->exprsnum = iVar12 + 1;
      peVar9->exprs[iVar12] = peVar11;
      if (iVar1 <= (int)local_58) {
        iVar12 = iVar1 * 2;
        if (iVar1 == 0) {
          iVar12 = 0x10;
        }
        peVar5->operandsmax = iVar12;
        __ptr_00 = (easm_operand **)realloc(__ptr_00,(long)iVar12 << 3);
        peVar5->operands = __ptr_00;
        iVar1 = iVar12;
      }
      peVar5->operandsnum = (int)local_58 + 1U;
      __ptr_00[local_58] = peVar9;
      iVar12 = *spos;
      local_58 = (ulong)((int)local_58 + 1U);
    }
  }
  peVar5->mods = peVar7;
  return peVar5;
}

Assistant:

static struct easm_sinsn *dis_parse_sinsn(struct disctx *ctx, enum dis_status *status, int *spos) {
	struct easm_sinsn *res = calloc(sizeof *res, 1);
	res->str = ctx->atoms[*spos]->str;
	res->isunk = ctx->atoms[*spos]->isunk;
	if (res->isunk)
		*status |= DIS_STATUS_UNK_INSN;
	if (ctx->atoms[(*spos)++]->type != LITEM_NAME)
		abort();
	struct easm_mods *mods = calloc (sizeof *mods, 1);
	while (*spos < ctx->atomsnum && ctx->atoms[*spos]->type != LITEM_SEEND) {
		if (ctx->atoms[*spos]->type == LITEM_NAME) {
			struct easm_mod *mod = calloc(sizeof *mod, 1);
			mod->str = ctx->atoms[*spos]->str;
			mod->isunk = ctx->atoms[*spos]->isunk;
			if (mod->isunk)
				*status |= DIS_STATUS_UNK_OPERAND;
			ADDARRAY(mods->mods, mod);
			(*spos)++;
		} else {
			struct easm_operand *op = calloc (sizeof *op, 1);
			op->mods = mods;
			mods = calloc (sizeof *mods, 1);
			ADDARRAY(op->exprs, dis_parse_expr(ctx, status, spos));
			ADDARRAY(res->operands, op);
		}
	}
	res->mods = mods;
	return res;
}